

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Minisat::sort<unsigned_int,reduceDB_tch>(uint *array,int size,reduceDB_tch lt)

{
  ulong uVar1;
  uint *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint *puVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint *__dest;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  uint *puVar26;
  uint *array_00;
  int size_00;
  long lVar27;
  ulong uVar28;
  
  array_00 = array;
  if (0xf < size) {
    do {
      uVar25 = size;
      uVar21 = (ulong)uVar25;
      if (0x20 < uVar25) {
        puVar12 = (uint *)operator_new__(uVar21 * 4);
        uVar14 = 1;
        bVar8 = false;
        do {
          bVar9 = bVar8;
          __dest = array_00;
          array_00 = puVar12;
          uVar5 = uVar14 * 2;
          uVar13 = 0;
          puVar12 = array_00;
          uVar20 = uVar5;
          uVar11 = uVar14;
          do {
            uVar17 = uVar20;
            if ((int)uVar25 < (int)uVar20) {
              uVar17 = uVar25;
            }
            uVar16 = (long)(int)uVar5 + uVar13;
            uVar15 = (uint)uVar16;
            if ((int)uVar25 < (int)(uint)uVar16) {
              uVar15 = uVar25;
            }
            uVar1 = uVar13 + (long)(int)uVar14;
            uVar18 = (uint)uVar1;
            uVar22 = uVar14 + uVar18;
            if ((int)uVar25 <= (int)(uVar14 + uVar18)) {
              uVar22 = uVar25;
            }
            uVar10 = (uint)uVar13;
            if (((int)uVar14 < 1) || ((long)(int)uVar22 <= (long)uVar1)) {
              lVar27 = (long)(int)uVar10;
              uVar19 = uVar10;
              uVar23 = uVar10;
            }
            else {
              puVar6 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
              uVar24 = uVar13 & 0xffffffff;
              uVar28 = uVar1 & 0xffffffff;
              uVar13 = uVar13 & 0xffffffff;
              puVar26 = puVar12;
              do {
                lVar27 = (long)(int)uVar13;
                puVar2 = __dest + lVar27;
                uVar23 = __dest[(int)uVar28];
                puVar3 = (ulong *)(puVar6 + *puVar2);
                puVar4 = (ulong *)(puVar6 + uVar23);
                if (*(uint *)((long)puVar3 + (*puVar3 >> 0x22) * 4 + 0xc) <
                    *(uint *)((long)puVar4 + (*puVar4 >> 0x22) * 4 + 0xc)) {
                  uVar18 = (int)uVar13 + 1;
                  uVar13 = (ulong)uVar18;
                  lVar27 = (long)(int)uVar18;
                  uVar23 = *puVar2;
                }
                else {
                  uVar28 = (ulong)((int)uVar28 + 1);
                }
                uVar18 = (uint)uVar28;
                uVar19 = (uint)uVar13;
                *puVar26 = uVar23;
                uVar23 = (int)uVar24 + 1;
                uVar24 = (ulong)uVar23;
              } while ((lVar27 < (long)uVar1) && (puVar26 = puVar26 + 1, (int)uVar18 < (int)uVar22))
              ;
            }
            if (lVar27 < (long)uVar1) {
              memcpy(array_00 + (int)uVar23,__dest + lVar27,
                     (ulong)((uVar10 + (uVar14 - 1)) - uVar19) * 4 + 4);
              uVar23 = (uVar23 + uVar11) - (int)lVar27;
            }
            if ((int)uVar18 < (int)uVar22) {
              memcpy(array_00 + (int)uVar23,__dest + (int)uVar18,(ulong)(uVar15 + ~uVar18) * 4 + 4);
              uVar23 = (uVar23 + uVar17) - uVar18;
            }
            uVar11 = uVar11 + uVar5;
            uVar20 = uVar20 + uVar5;
            puVar12 = puVar12 + (int)uVar5;
            uVar13 = uVar16;
          } while ((long)uVar16 < (long)(uVar21 - (long)(int)uVar14));
          if ((int)uVar23 < (int)uVar25) {
            memcpy(array_00 + (int)uVar23,__dest + (int)uVar23,(ulong)(~uVar23 + uVar25) * 4 + 4);
          }
          puVar12 = __dest;
          uVar14 = uVar5;
          bVar8 = (bool)(bVar9 ^ 1);
        } while ((int)uVar5 < (int)uVar25);
        if (!bVar9) {
          memcpy(__dest,array_00,uVar21 * 4);
          __dest = array_00;
        }
        if (__dest == (uint *)0x0) {
          return;
        }
        operator_delete__(__dest);
        return;
      }
      uVar14 = array_00[uVar25 >> 1];
      puVar12 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
      lVar27 = -1;
      while( true ) {
        uVar5 = *(uint *)((long)puVar12 +
                         (ulong)(puVar12[(ulong)uVar14 + 1] & 0xfffffffc) + (ulong)uVar14 * 4 + 0xc)
        ;
        lVar27 = (long)(int)lVar27;
        array = array_00 + lVar27;
        do {
          lVar27 = lVar27 + 1;
          uVar11 = array[1];
          array = array + 1;
        } while (*(uint *)((long)(puVar12 + uVar11) +
                          (*(ulong *)(puVar12 + uVar11) >> 0x22) * 4 + 0xc) < uVar5);
        uVar21 = (ulong)(int)uVar21;
        do {
          lVar7 = uVar21 - 1;
          uVar21 = uVar21 - 1;
        } while (uVar5 < *(uint *)((long)(puVar12 + array_00[lVar7]) +
                                  (*(ulong *)(puVar12 + array_00[lVar7]) >> 0x22) * 4 + 0xc));
        if ((long)uVar21 <= lVar27) break;
        *array = array_00[lVar7];
        array_00[uVar21] = uVar11;
      }
      size_00 = (int)lVar27;
      sort<unsigned_int,reduceDB_tch>(array_00,size_00,lt);
      array_00 = array;
      size = uVar25 - size_00;
    } while (0xf < (int)(uVar25 - size_00));
    size = uVar25 - size_00;
  }
  selectionSort<unsigned_int,reduceDB_tch>(array,size,lt);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}